

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall TPZSkylMatrix<float>::ReallocForNuma(TPZSkylMatrix<float> *this)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  float **ppfVar4;
  long lVar5;
  
  TPZVec<float_*>::ReallocForNuma(&this->fElem);
  pfVar1 = (this->fStorage).fStore;
  TPZVec<float>::ReallocForNuma(&this->fStorage);
  lVar2 = (this->fElem).fNElements;
  if (0 < lVar2) {
    pfVar3 = (this->fStorage).fStore;
    lVar5 = 0;
    do {
      ppfVar4 = (this->fElem).fStore;
      ppfVar4[lVar5] = (float *)(((long)ppfVar4[lVar5] - (long)pfVar1) + (long)pfVar3);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}